

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O3

void __thiscall
HeadersGeneratorSetup::GenerateHeaders
          (HeadersGeneratorSetup *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
          size_t count,uint256 *starting_hash,int nVersion,int prev_time,uint256 *merkle_root,
          uint32_t nBits)

{
  iterator __position;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  base_blob<256U> *pbVar4;
  long lVar5;
  pointer pCVar6;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined8 uStack_50;
  _Head_base<0UL,_kernel::Context_*,_false> local_48;
  _Head_base<0UL,_ECC_Context_*,_false> _Stack_40;
  Init *local_38;
  
  local_38 = *(Init **)(in_FS_OFFSET + 0x28);
  local_58 = *(undefined8 *)(starting_hash->super_base_blob<256U>).m_data._M_elems;
  uStack_50 = *(undefined8 *)((starting_hash->super_base_blob<256U>).m_data._M_elems + 8);
  local_48._M_head_impl =
       *(Context **)((starting_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  _Stack_40._M_head_impl =
       *(ECC_Context **)((starting_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  __position._M_current =
       (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  lVar5 = (long)__position._M_current -
          (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start;
  while ((ulong)((lVar5 >> 4) * -0x3333333333333333) < count) {
    if (__position._M_current ==
        (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this = (HeadersGeneratorSetup *)headers;
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::_M_realloc_insert<>
                (headers,__position);
      pCVar6 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *(undefined8 *)
       (((__position._M_current)->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
      (__position._M_current)->nBits = 0;
      (__position._M_current)->nNonce = 0;
      pbVar4 = &((__position._M_current)->hashMerkleRoot).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0xc] = '\0';
      (pbVar4->m_data)._M_elems[0xd] = '\0';
      (pbVar4->m_data)._M_elems[0xe] = '\0';
      (pbVar4->m_data)._M_elems[0xf] = '\0';
      (pbVar4->m_data)._M_elems[0x10] = '\0';
      (pbVar4->m_data)._M_elems[0x11] = '\0';
      (pbVar4->m_data)._M_elems[0x12] = '\0';
      (pbVar4->m_data)._M_elems[0x13] = '\0';
      pbVar4 = &((__position._M_current)->hashMerkleRoot).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0x14] = '\0';
      (pbVar4->m_data)._M_elems[0x15] = '\0';
      (pbVar4->m_data)._M_elems[0x16] = '\0';
      (pbVar4->m_data)._M_elems[0x17] = '\0';
      (pbVar4->m_data)._M_elems[0x18] = '\0';
      (pbVar4->m_data)._M_elems[0x19] = '\0';
      (pbVar4->m_data)._M_elems[0x1a] = '\0';
      (pbVar4->m_data)._M_elems[0x1b] = '\0';
      *(undefined8 *)
       (((__position._M_current)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
      pbVar4 = &((__position._M_current)->hashMerkleRoot).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[4] = '\0';
      (pbVar4->m_data)._M_elems[5] = '\0';
      (pbVar4->m_data)._M_elems[6] = '\0';
      (pbVar4->m_data)._M_elems[7] = '\0';
      (pbVar4->m_data)._M_elems[8] = '\0';
      (pbVar4->m_data)._M_elems[9] = '\0';
      (pbVar4->m_data)._M_elems[10] = '\0';
      (pbVar4->m_data)._M_elems[0xb] = '\0';
      pbVar4 = &((__position._M_current)->hashPrevBlock).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0xc] = '\0';
      (pbVar4->m_data)._M_elems[0xd] = '\0';
      (pbVar4->m_data)._M_elems[0xe] = '\0';
      (pbVar4->m_data)._M_elems[0xf] = '\0';
      (pbVar4->m_data)._M_elems[0x10] = '\0';
      (pbVar4->m_data)._M_elems[0x11] = '\0';
      (pbVar4->m_data)._M_elems[0x12] = '\0';
      (pbVar4->m_data)._M_elems[0x13] = '\0';
      pbVar4 = &((__position._M_current)->hashPrevBlock).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0x14] = '\0';
      (pbVar4->m_data)._M_elems[0x15] = '\0';
      (pbVar4->m_data)._M_elems[0x16] = '\0';
      (pbVar4->m_data)._M_elems[0x17] = '\0';
      (pbVar4->m_data)._M_elems[0x18] = '\0';
      (pbVar4->m_data)._M_elems[0x19] = '\0';
      (pbVar4->m_data)._M_elems[0x1a] = '\0';
      (pbVar4->m_data)._M_elems[0x1b] = '\0';
      (__position._M_current)->nVersion = 0;
      ((__position._M_current)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = '\0';
      ((__position._M_current)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = '\0';
      ((__position._M_current)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = '\0';
      ((__position._M_current)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = '\0';
      pbVar4 = &((__position._M_current)->hashPrevBlock).super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[4] = '\0';
      (pbVar4->m_data)._M_elems[5] = '\0';
      (pbVar4->m_data)._M_elems[6] = '\0';
      (pbVar4->m_data)._M_elems[7] = '\0';
      (pbVar4->m_data)._M_elems[8] = '\0';
      (pbVar4->m_data)._M_elems[9] = '\0';
      (pbVar4->m_data)._M_elems[10] = '\0';
      (pbVar4->m_data)._M_elems[0xb] = '\0';
      pCVar6 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
      (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish = pCVar6;
    }
    pCVar6[-1].nVersion = nVersion;
    *(undefined8 *)pCVar6[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems = local_58;
    *(undefined8 *)(pCVar6[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) = uStack_50;
    *(Context **)(pCVar6[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_48._M_head_impl;
    *(ECC_Context **)(pCVar6[-1].hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
         _Stack_40._M_head_impl;
    uVar1 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 8);
    uVar2 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 0x10);
    uVar3 = *(undefined8 *)((merkle_root->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)pCVar6[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
         *(undefined8 *)(merkle_root->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)(pCVar6[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) = uVar1;
    *(undefined8 *)(pCVar6[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) = uVar2;
    *(undefined8 *)(pCVar6[-1].hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar3;
    pCVar6[-1].nTime = prev_time + 1;
    pCVar6[-1].nBits = nBits;
    FindProofOfWork(this,pCVar6 + -1);
    this = (HeadersGeneratorSetup *)&stack0xffffffffffffffa8;
    CBlockHeader::GetHash((uint256 *)this,pCVar6 + -1);
    __position._M_current =
         (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    prev_time = pCVar6[-1].nTime;
    lVar5 = (long)__position._M_current -
            (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl
                  .super__Vector_impl_data._M_start;
  }
  if (*(Init **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersGeneratorSetup::GenerateHeaders(std::vector<CBlockHeader>& headers,
        size_t count, const uint256& starting_hash, const int nVersion, int prev_time,
        const uint256& merkle_root, const uint32_t nBits)
{
    uint256 prev_hash = starting_hash;

    while (headers.size() < count) {
        headers.emplace_back();
        CBlockHeader& next_header = headers.back();;
        next_header.nVersion = nVersion;
        next_header.hashPrevBlock = prev_hash;
        next_header.hashMerkleRoot = merkle_root;
        next_header.nTime = prev_time+1;
        next_header.nBits = nBits;

        FindProofOfWork(next_header);
        prev_hash = next_header.GetHash();
        prev_time = next_header.nTime;
    }
    return;
}